

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O3

void __thiscall polyscope::CurveNetwork::drawDelayed(CurveNetwork *this)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  
  bVar1 = Structure::isEnabled((Structure *)this);
  if (bVar1) {
    for (p_Var2 = *(_Rb_tree_node_base **)
                   &(this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure.
                    field_0x3d8;
        p_Var2 != (_Rb_tree_node_base *)
                  &(this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure.
                   field_0x3c8; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      (**(code **)(**(long **)(p_Var2 + 2) + 0x18))();
    }
    for (p_Var2 = (this->super_QuantityStructure<polyscope::CurveNetwork>).floatingQuantities._M_t.
                  _M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 !=
        &(this->super_QuantityStructure<polyscope::CurveNetwork>).floatingQuantities._M_t._M_impl.
         super__Rb_tree_header; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      (**(code **)(**(long **)(p_Var2 + 2) + 0x18))();
    }
  }
  return;
}

Assistant:

void CurveNetwork::drawDelayed() {
  if (!isEnabled()) {
    return;
  }

  for (auto& x : quantities) {
    x.second->drawDelayed();
  }
  for (auto& x : floatingQuantities) {
    x.second->drawDelayed();
  }
}